

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGComputeInterleaves(void *payload,void *data,xmlChar *name)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  xmlRelaxNGDefinePtr_conflict *ppxVar5;
  int *__s;
  xmlHashTablePtr pxVar6;
  int local_78;
  int local_74;
  int is_determinist;
  int is_mixed;
  int nbchild;
  int nbgroups;
  int res;
  int ret;
  int j;
  int i;
  xmlRelaxNGInterleaveGroupPtr group;
  xmlRelaxNGInterleaveGroupPtr *groups;
  xmlRelaxNGPartitionPtr partitions;
  xmlRelaxNGDefinePtr_conflict *tmp;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGParserCtxtPtr ctxt;
  xmlRelaxNGDefinePtr_conflict def;
  xmlChar *name_local;
  void *data_local;
  void *payload_local;
  
  is_mixed = 0;
  is_determinist = 0;
  local_74 = 0;
  local_78 = 1;
  if (*(int *)((long)data + 0x44) == 0) {
    for (tmp = *(xmlRelaxNGDefinePtr_conflict **)((long)payload + 0x30);
        tmp != (xmlRelaxNGDefinePtr_conflict *)0x0; tmp = (xmlRelaxNGDefinePtr_conflict *)tmp[8]) {
      is_determinist = is_determinist + 1;
    }
    pvVar3 = (*xmlMalloc)((long)is_determinist << 3);
    if (pvVar3 != (void *)0x0) {
      for (tmp = *(xmlRelaxNGDefinePtr_conflict **)((long)payload + 0x30);
          tmp != (xmlRelaxNGDefinePtr_conflict *)0x0; tmp = (xmlRelaxNGDefinePtr_conflict *)tmp[8])
      {
        pvVar4 = (*xmlMalloc)(0x18);
        *(void **)((long)pvVar3 + (long)is_mixed * 8) = pvVar4;
        if (*(long *)((long)pvVar3 + (long)is_mixed * 8) == 0) goto LAB_001be736;
        if (*(int *)tmp == 3) {
          local_74 = local_74 + 1;
        }
        **(undefined8 **)((long)pvVar3 + (long)is_mixed * 8) = tmp;
        ppxVar5 = xmlRelaxNGGetElements
                            ((xmlRelaxNGParserCtxtPtr)data,(xmlRelaxNGDefinePtr_conflict)tmp,2);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar3 + (long)is_mixed * 8) + 8) =
             ppxVar5;
        ppxVar5 = xmlRelaxNGGetElements
                            ((xmlRelaxNGParserCtxtPtr)data,(xmlRelaxNGDefinePtr_conflict)tmp,1);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar3 + (long)is_mixed * 8) + 0x10) =
             ppxVar5;
        is_mixed = is_mixed + 1;
      }
      __s = (int *)(*xmlMalloc)(0x20);
      if (__s != (int *)0x0) {
        memset(__s,0,0x20);
        *__s = is_mixed;
        pxVar6 = xmlHashCreate(is_mixed);
        *(xmlHashTablePtr *)(__s + 2) = pxVar6;
        for (ret = 0; ret < is_mixed; ret = ret + 1) {
          lVar1 = *(long *)((long)pvVar3 + (long)ret * 8);
          res = ret;
          while (res = res + 1, res < is_mixed) {
            if (*(long *)((long)pvVar3 + (long)res * 8) != 0) {
              iVar2 = xmlRelaxNGCompareElemDefLists
                                ((xmlRelaxNGParserCtxtPtr)data,
                                 *(xmlRelaxNGDefinePtr_conflict **)(lVar1 + 8),
                                 *(xmlRelaxNGDefinePtr_conflict **)
                                  (*(long *)((long)pvVar3 + (long)res * 8) + 8));
              if (iVar2 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3fd,
                           "Element or text conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0
                          );
              }
              iVar2 = xmlRelaxNGCompareElemDefLists
                                ((xmlRelaxNGParserCtxtPtr)data,
                                 *(xmlRelaxNGDefinePtr_conflict **)(lVar1 + 0x10),
                                 *(xmlRelaxNGDefinePtr_conflict **)
                                  (*(long *)((long)pvVar3 + (long)res * 8) + 0x10));
              if (iVar2 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3e9,
                           "Attributes conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0);
              }
            }
          }
          partitions = *(xmlRelaxNGPartitionPtr *)(lVar1 + 8);
          if ((partitions == (xmlRelaxNGPartitionPtr)0x0) || (*(long *)partitions == 0)) {
            local_78 = 0;
          }
          else {
            for (; *(long *)partitions != 0;
                partitions = (xmlRelaxNGPartitionPtr)&partitions->triage) {
              if (**(int **)partitions == 3) {
                iVar2 = xmlHashAddEntry2(*(xmlHashTablePtr *)(__s + 2),(xmlChar *)"#text",
                                         (xmlChar *)0x0,(void *)(long)(ret + 1));
                if (iVar2 != 0) {
                  local_78 = -1;
                }
              }
              else if ((**(int **)partitions == 4) && (*(long *)(*(long *)partitions + 0x10) != 0))
              {
                if ((*(long *)(*(long *)partitions + 0x18) == 0) ||
                   (**(char **)(*(long *)partitions + 0x18) == '\0')) {
                  nbchild = xmlHashAddEntry2(*(xmlHashTablePtr *)(__s + 2),
                                             *(xmlChar **)(*(long *)partitions + 0x10),
                                             (xmlChar *)0x0,(void *)(long)(ret + 1));
                }
                else {
                  nbchild = xmlHashAddEntry2(*(xmlHashTablePtr *)(__s + 2),
                                             *(xmlChar **)(*(long *)partitions + 0x10),
                                             *(xmlChar **)(*(long *)partitions + 0x18),
                                             (void *)(long)(ret + 1));
                }
                if (nbchild != 0) {
                  local_78 = -1;
                }
              }
              else if (**(int **)partitions == 4) {
                if ((*(long *)(*(long *)partitions + 0x18) == 0) ||
                   (**(char **)(*(long *)partitions + 0x18) == '\0')) {
                  nbchild = xmlHashAddEntry2(*(xmlHashTablePtr *)(__s + 2),"#any",(xmlChar *)0x0,
                                             (void *)(long)(ret + 1));
                }
                else {
                  nbchild = xmlHashAddEntry2(*(xmlHashTablePtr *)(__s + 2),"#any",
                                             *(xmlChar **)(*(long *)partitions + 0x18),
                                             (void *)(long)(ret + 1));
                }
                if (*(long *)(*(long *)partitions + 0x50) != 0) {
                  local_78 = 2;
                }
                if (nbchild != 0) {
                  local_78 = -1;
                }
              }
              else {
                local_78 = -1;
              }
            }
          }
        }
        *(void **)(__s + 6) = pvVar3;
        *(int **)((long)payload + 0x28) = __s;
        if (local_74 != 0) {
          *(ushort *)((long)payload + 0x62) = *(ushort *)((long)payload + 0x62) | 8;
        }
        if (local_78 == 1) {
          __s[4] = 1;
        }
        if (local_78 != 2) {
          return;
        }
        __s[4] = 3;
        return;
      }
    }
LAB_001be736:
    xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)data);
    if (pvVar3 != (void *)0x0) {
      for (ret = 0; ret < is_mixed; ret = ret + 1) {
        if (*(long *)((long)pvVar3 + (long)ret * 8) != 0) {
          if (*(long *)(*(long *)((long)pvVar3 + (long)ret * 8) + 8) != 0) {
            (*xmlFree)(*(void **)(*(long *)((long)pvVar3 + (long)ret * 8) + 8));
          }
          (*xmlFree)(*(void **)((long)pvVar3 + (long)ret * 8));
        }
      }
      (*xmlFree)(pvVar3);
    }
    xmlRelaxNGFreePartition((xmlRelaxNGPartitionPtr)0x0);
  }
  return;
}

Assistant:

static void
xmlRelaxNGComputeInterleaves(void *payload, void *data,
                             const xmlChar * name ATTRIBUTE_UNUSED)
{
    xmlRelaxNGDefinePtr def = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGDefinePtr cur, *tmp;

    xmlRelaxNGPartitionPtr partitions = NULL;
    xmlRelaxNGInterleaveGroupPtr *groups = NULL;
    xmlRelaxNGInterleaveGroupPtr group;
    int i, j, ret, res;
    int nbgroups = 0;
    int nbchild = 0;
    int is_mixed = 0;
    int is_determinist = 1;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    groups = (xmlRelaxNGInterleaveGroupPtr *)
        xmlMalloc(nbchild * sizeof(xmlRelaxNGInterleaveGroupPtr));
    if (groups == NULL)
        goto error;
    cur = def->content;
    while (cur != NULL) {
        groups[nbgroups] = (xmlRelaxNGInterleaveGroupPtr)
            xmlMalloc(sizeof(xmlRelaxNGInterleaveGroup));
        if (groups[nbgroups] == NULL)
            goto error;
        if (cur->type == XML_RELAXNG_TEXT)
            is_mixed++;
        groups[nbgroups]->rule = cur;
        groups[nbgroups]->defs = xmlRelaxNGGetElements(ctxt, cur, 2);
        groups[nbgroups]->attrs = xmlRelaxNGGetElements(ctxt, cur, 1);
        nbgroups++;
        cur = cur->next;
    }

    /*
     * Let's check that all rules makes a partitions according to 7.4
     */
    partitions = (xmlRelaxNGPartitionPtr)
        xmlMalloc(sizeof(xmlRelaxNGPartition));
    if (partitions == NULL)
        goto error;
    memset(partitions, 0, sizeof(xmlRelaxNGPartition));
    partitions->nbgroups = nbgroups;
    partitions->triage = xmlHashCreate(nbgroups);
    for (i = 0; i < nbgroups; i++) {
        group = groups[i];
        for (j = i + 1; j < nbgroups; j++) {
            if (groups[j] == NULL)
                continue;

            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->defs,
                                                groups[j]->defs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ELEM_TEXT_CONFLICT,
                           "Element or text conflicts in interleave\n",
                           NULL, NULL);
            }
            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->attrs,
                                                groups[j]->attrs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ATTR_CONFLICT,
                           "Attributes conflicts in interleave\n", NULL,
                           NULL);
            }
        }
        tmp = group->defs;
        if ((tmp != NULL) && (*tmp != NULL)) {
            while (*tmp != NULL) {
                if ((*tmp)->type == XML_RELAXNG_TEXT) {
                    res = xmlHashAddEntry2(partitions->triage,
                                           BAD_CAST "#text", NULL,
                                           XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if (((*tmp)->type == XML_RELAXNG_ELEMENT) &&
                           ((*tmp)->name != NULL)) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if ((*tmp)->type == XML_RELAXNG_ELEMENT) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if ((*tmp)->nameClass != NULL)
                        is_determinist = 2;
                    if (res != 0)
                        is_determinist = -1;
                } else {
                    is_determinist = -1;
                }
                tmp++;
            }
        } else {
            is_determinist = 0;
        }
    }
    partitions->groups = groups;

    /*
     * and save the partition list back in the def
     */
    def->data = partitions;
    if (is_mixed != 0)
        def->dflags |= IS_MIXED;
    if (is_determinist == 1)
        partitions->flags = IS_DETERMINIST;
    if (is_determinist == 2)
        partitions->flags = IS_DETERMINIST | IS_NEEDCHECK;
    return;

  error:
    xmlRngPErrMemory(ctxt);
    if (groups != NULL) {
        for (i = 0; i < nbgroups; i++)
            if (groups[i] != NULL) {
                if (groups[i]->defs != NULL)
                    xmlFree(groups[i]->defs);
                xmlFree(groups[i]);
            }
        xmlFree(groups);
    }
    xmlRelaxNGFreePartition(partitions);
}